

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrB
          (X3DImporter *this,int pAttrIdx,vector<bool,_std::allocator<bool>_> *pValue)

{
  char cVar1;
  FIReader *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  WordIterator wordItBegin;
  shared_ptr<const_Assimp::FIBoolValue> boolValue;
  WordIterator local_58;
  shared_ptr<const_Assimp::FIValue> local_48;
  WordIterator local_38;
  char *__s;
  
  pFVar2 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_58,pFVar2,pAttrIdx);
  std::dynamic_pointer_cast<Assimp::FIBoolValue_const,Assimp::FIValue_const>(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.end_);
  if (local_48.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar2,pAttrIdx);
    __s = (char *)CONCAT44(extraout_var,iVar3);
    (pValue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         (pValue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    (pValue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    sVar4 = strlen(__s);
    WordIterator::WordIterator(&local_58,__s,__s + sVar4);
    local_38.start_ = local_58.start_;
    local_38.end_ = local_58.end_;
    while (local_38.start_ != (char *)0x0) {
      cVar1 = *local_38.start_;
      iVar3 = tolower((int)cVar1);
      std::vector<bool,_std::allocator<bool>_>::push_back(pValue,iVar3 == 0x74 || cVar1 == 0x31);
      WordIterator::operator++(&local_38);
    }
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::operator=
              (pValue,(vector<bool,_std::allocator<bool>_> *)
                      (local_48.
                       super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 1));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrB(const int pAttrIdx, std::vector<bool>& pValue)
{
    auto boolValue = std::dynamic_pointer_cast<const FIBoolValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (boolValue) {
        pValue = boolValue->value;
    }
    else {
        const char *val = mReader->getAttributeValue(pAttrIdx);
        pValue.clear();

        //std::cregex_iterator wordItBegin(val, val + strlen(val), pattern_nws);
        //const std::cregex_iterator wordItEnd;
        //std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const std::cmatch &match) { return std::regex_match(match.str(), pattern_true); });

        WordIterator wordItBegin(val, val + strlen(val));
        WordIterator wordItEnd;
        std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const char *match) { return (::tolower(match[0]) == 't') || (match[0] == '1'); });
    }
}